

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_division.h
# Opt level: O0

double fast_division::divide32<67910U>::remainder(double __x,double __y)

{
  double extraout_XMM0_Qa;
  
  quotient(0);
  return extraout_XMM0_Qa;
}

Assistant:

static inline uint32_t remainder(uint32_t n) noexcept {
    if (is_power_2) {
      return n & power_2_mask;
    }
    if (overflow) {
      return n - quotient(n) * divisor;
    } else {
      return uint32_t(((internal_product(n) % m) * divisor) >>
                      (32 + log2_divisor));
    }
  }